

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

int cuddGarbageCollect(DdManager *unique,int clearCache)

{
  uint uVar1;
  DdCache *pDVar2;
  DdNode **ppDVar3;
  DdNodePtr pDVar4;
  int iVar5;
  abctime aVar6;
  DdCache *pDVar7;
  ulong uVar8;
  DdNode *pDVar9;
  abctime aVar10;
  int res_2;
  ptruint offset;
  int res_1;
  int res;
  int k;
  DdNode *sentry;
  DdNode *downTrav;
  DdNodePtr *nxtNode;
  DdNodePtr *memListTrav;
  long localTime;
  DdNode **ppDStack_78;
  int slots;
  DdNodePtr *lastP;
  DdNode *next;
  DdNode *node;
  DdCache *c;
  uint local_50;
  int totalDeletedZ;
  int totalDeleted;
  int deleted;
  int j;
  int i;
  DdNodePtr *nodelist;
  DdNode *sentinel;
  DdCache *cache;
  DdHook *hook;
  int clearCache_local;
  DdManager *unique_local;
  
  pDVar2 = unique->cache;
  cuddClearDeathRow(unique);
  for (cache = (DdCache *)unique->preGCHook; cache != (DdCache *)0x0; cache = (DdCache *)cache->g) {
    iVar5 = (*(code *)cache->f)(unique,"DD",0);
    if (iVar5 == 0) {
      return 0;
    }
  }
  if (unique->dead + unique->deadZ == 0) {
    for (cache = (DdCache *)unique->postGCHook; cache != (DdCache *)0x0; cache = (DdCache *)cache->g
        ) {
      iVar5 = (*(code *)cache->f)(unique,"DD",0);
      if (iVar5 == 0) {
        return 0;
      }
    }
    unique_local._4_4_ = 0;
  }
  else if ((((clearCache == 0) || (unique->gcFrac != 1.0)) || (NAN(unique->gcFrac))) ||
          ((unique->looseUpTo < unique->slots || (unique->stash == (char *)0x0)))) {
    aVar6 = Extra_CpuTime();
    unique->garbageCollections = unique->garbageCollections + 1;
    if (clearCache != 0) {
      uVar1 = unique->cacheSlots;
      for (deleted = 0; deleted < (int)uVar1; deleted = deleted + 1) {
        pDVar7 = pDVar2 + deleted;
        if ((pDVar7->data != (DdNode *)0x0) &&
           ((((*(int *)(((ulong)pDVar7->f & 0xfffffffffffffff0) + 4) == 0 ||
              (*(int *)(((ulong)pDVar7->g & 0xfffffffffffffff0) + 4) == 0)) ||
             ((((ulong)pDVar7->f & 2) != 0 && (*(int *)((pDVar7->h & 0xfffffffffffffffe) + 4) == 0))
             )) || ((pDVar7->data != (DdNode *)0x1 &&
                    (*(int *)(((ulong)pDVar7->data & 0xfffffffffffffffe) + 4) == 0)))))) {
          pDVar7->data = (DdNode *)0x0;
          unique->cachedeletions = unique->cachedeletions + 1.0;
        }
      }
      cuddLocalCacheClearDead(unique);
    }
    local_50 = 0;
    for (deleted = 0; deleted < unique->size; deleted = deleted + 1) {
      if (unique->subtables[deleted].dead != 0) {
        ppDVar3 = unique->subtables[deleted].nodelist;
        totalDeletedZ = 0;
        uVar1 = unique->subtables[deleted].slots;
        for (totalDeleted = 0; totalDeleted < (int)uVar1; totalDeleted = totalDeleted + 1) {
          ppDStack_78 = ppDVar3 + totalDeleted;
          next = *ppDStack_78;
          while ((DdManager *)next != unique) {
            pDVar9 = next->next;
            if (next->ref == 0) {
              totalDeletedZ = totalDeletedZ + 1;
              next = pDVar9;
            }
            else {
              *ppDStack_78 = next;
              ppDStack_78 = &next->next;
              next = pDVar9;
            }
          }
          *ppDStack_78 = &unique->sentinel;
        }
        if (totalDeletedZ != unique->subtables[deleted].dead) {
          ddReportRefMess(unique,deleted,"cuddGarbageCollect");
        }
        local_50 = totalDeletedZ + local_50;
        unique->subtables[deleted].keys = unique->subtables[deleted].keys - totalDeletedZ;
        unique->subtables[deleted].dead = 0;
      }
    }
    if ((unique->constants).dead != 0) {
      ppDVar3 = (unique->constants).nodelist;
      totalDeletedZ = 0;
      uVar1 = (unique->constants).slots;
      for (totalDeleted = 0; totalDeleted < (int)uVar1; totalDeleted = totalDeleted + 1) {
        ppDStack_78 = ppDVar3 + totalDeleted;
        next = *ppDStack_78;
        while (next != (DdNode *)0x0) {
          pDVar9 = next->next;
          if (next->ref == 0) {
            totalDeletedZ = totalDeletedZ + 1;
            next = pDVar9;
          }
          else {
            *ppDStack_78 = next;
            ppDStack_78 = &next->next;
            next = pDVar9;
          }
        }
        *ppDStack_78 = (DdNode *)0x0;
      }
      if (totalDeletedZ != (unique->constants).dead) {
        ddReportRefMess(unique,0x7fffffff,"cuddGarbageCollect");
      }
      local_50 = totalDeletedZ + local_50;
      (unique->constants).keys = (unique->constants).keys - totalDeletedZ;
      (unique->constants).dead = 0;
    }
    if (local_50 != unique->dead) {
      ddReportRefMess(unique,-1,"cuddGarbageCollect");
    }
    unique->keys = unique->keys - local_50;
    unique->dead = 0;
    c._4_4_ = 0;
    for (deleted = 0; deleted < unique->sizeZ; deleted = deleted + 1) {
      if (unique->subtableZ[deleted].dead != 0) {
        ppDVar3 = unique->subtableZ[deleted].nodelist;
        totalDeletedZ = 0;
        uVar1 = unique->subtableZ[deleted].slots;
        for (totalDeleted = 0; totalDeleted < (int)uVar1; totalDeleted = totalDeleted + 1) {
          ppDStack_78 = ppDVar3 + totalDeleted;
          next = *ppDStack_78;
          while (next != (DdNode *)0x0) {
            pDVar9 = next->next;
            if (next->ref == 0) {
              totalDeletedZ = totalDeletedZ + 1;
              next = pDVar9;
            }
            else {
              *ppDStack_78 = next;
              ppDStack_78 = &next->next;
              next = pDVar9;
            }
          }
          *ppDStack_78 = (DdNode *)0x0;
        }
        if (totalDeletedZ != unique->subtableZ[deleted].dead) {
          ddReportRefMess(unique,deleted,"cuddGarbageCollect");
        }
        c._4_4_ = totalDeletedZ + c._4_4_;
        unique->subtableZ[deleted].keys = unique->subtableZ[deleted].keys - totalDeletedZ;
        unique->subtableZ[deleted].dead = 0;
      }
    }
    if (c._4_4_ != unique->deadZ) {
      ddReportRefMess(unique,-1,"cuddGarbageCollect");
    }
    unique->keysZ = unique->keysZ - c._4_4_;
    unique->deadZ = 0;
    _res = (DdNode *)0x0;
    pDVar4 = (DdNodePtr)unique->memoryList;
    while (nxtNode = (DdNodePtr *)pDVar4, nxtNode != (DdNodePtr *)0x0) {
      pDVar4 = *nxtNode;
      uVar8 = 0x20 - ((ulong)nxtNode & 0x1f) & 0xfffffffffffffff8;
      res_1 = 0;
      do {
        if (*(int *)((long)nxtNode + (long)res_1 * 0x28 + uVar8 + 4) == 0) {
          if (_res == (DdNode *)0x0) {
            _res = (DdNode *)((long)nxtNode + (long)res_1 * 0x28 + uVar8);
            unique->nextFree = _res;
          }
          else {
            pDVar9 = (DdNode *)((long)nxtNode + (long)res_1 * 0x28 + uVar8);
            _res->next = pDVar9;
            _res = pDVar9;
          }
        }
        res_1 = res_1 + 1;
      } while (res_1 < 0x3fe);
    }
    _res->next = (DdNode *)0x0;
    aVar10 = Extra_CpuTime();
    unique->GCTime = (aVar10 - aVar6) + unique->GCTime;
    for (cache = (DdCache *)unique->postGCHook; cache != (DdCache *)0x0; cache = (DdCache *)cache->g
        ) {
      iVar5 = (*(code *)cache->f)(unique,"DD",0);
      if (iVar5 == 0) {
        return 0;
      }
    }
    unique_local._4_4_ = local_50 + c._4_4_;
  }
  else {
    unique->minDead = (uint)(long)((double)unique->slots * 4.0);
    unique->gcFrac = 4.0;
    unique_local._4_4_ = 0;
  }
  return unique_local._4_4_;
}

Assistant:

int
cuddGarbageCollect(
  DdManager * unique,
  int  clearCache)
{
    DdHook      *hook;
    DdCache     *cache = unique->cache;
    DdNode      *sentinel = &(unique->sentinel);
    DdNodePtr   *nodelist;
    int         i, j, deleted, totalDeleted, totalDeletedZ;
    DdCache     *c;
    DdNode      *node,*next;
    DdNodePtr   *lastP;
    int         slots;
    long        localTime;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    DdNodePtr   tree;
#else
    DdNodePtr *memListTrav, *nxtNode;
    DdNode *downTrav, *sentry;
    int k;
#endif
#endif

#ifndef DD_NO_DEATH_ROW
    cuddClearDeathRow(unique);
#endif

    hook = unique->preGCHook;
    while (hook != NULL) {
        int res = (hook->f)(unique,"DD",NULL);
        if (res == 0) return(0);
        hook = hook->next;
    }

    if (unique->dead + unique->deadZ == 0) {
        hook = unique->postGCHook;
        while (hook != NULL) {
            int res = (hook->f)(unique,"DD",NULL);
            if (res == 0) return(0);
            hook = hook->next;
        }
        return(0);
    }

    /* If many nodes are being reclaimed, we want to resize the tables
    ** more aggressively, to reduce the frequency of garbage collection.
    */
    if (clearCache && unique->gcFrac == DD_GC_FRAC_LO &&
        unique->slots <= unique->looseUpTo && unique->stash != NULL) {
        unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_HI);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        unique->gcFrac = DD_GC_FRAC_HI;
        return(0);
    }

    localTime = util_cpu_time();

    unique->garbageCollections++;
#ifdef DD_VERBOSE
    (void) fprintf(unique->err,
                   "garbage collecting (%d dead BDD nodes out of %d, min %d)...",
                   unique->dead, unique->keys, unique->minDead);
    (void) fprintf(unique->err,
                   "                   (%d dead ZDD nodes out of %d)...",
                   unique->deadZ, unique->keysZ);
#endif

    /* Remove references to garbage collected nodes from the cache. */
    if (clearCache) {
        slots = unique->cacheSlots;
        for (i = 0; i < slots; i++) {
            c = &cache[i];
            if (c->data != NULL) {
                if (cuddClean(c->f)->ref == 0 ||
                cuddClean(c->g)->ref == 0 ||
                (((ptruint)c->f & 0x2) && Cudd_Regular(c->h)->ref == 0) ||
                (c->data != DD_NON_CONSTANT &&
                Cudd_Regular(c->data)->ref == 0)) {
                    c->data = NULL;
                    unique->cachedeletions++;
                }
            }
        }
        cuddLocalCacheClearDead(unique);
    }

    /* Now return dead nodes to free list. Count them for sanity check. */
    totalDeleted = 0;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    tree = NULL;
#endif
#endif

    for (i = 0; i < unique->size; i++) {
        if (unique->subtables[i].dead == 0) continue;
        nodelist = unique->subtables[i].nodelist;

        deleted = 0;
        slots = unique->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != sentinel) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = sentinel;
        }
        if ((unsigned) deleted != unique->subtables[i].dead) {
            ddReportRefMess(unique, i, "cuddGarbageCollect");
        }
        totalDeleted += deleted;
        unique->subtables[i].keys -= deleted;
        unique->subtables[i].dead = 0;
    }
    if (unique->constants.dead != 0) {
        nodelist = unique->constants.nodelist;
        deleted = 0;
        slots = unique->constants.slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != NULL) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = NULL;
        }
        if ((unsigned) deleted != unique->constants.dead) {
            ddReportRefMess(unique, CUDD_CONST_INDEX, "cuddGarbageCollect");
        }
        totalDeleted += deleted;
        unique->constants.keys -= deleted;
        unique->constants.dead = 0;
    }
    if ((unsigned) totalDeleted != unique->dead) {
        ddReportRefMess(unique, -1, "cuddGarbageCollect");
    }
    unique->keys -= totalDeleted;
    unique->dead = 0;
#ifdef DD_STATS
    unique->nodesFreed += (double) totalDeleted;
#endif

    totalDeletedZ = 0;

    for (i = 0; i < unique->sizeZ; i++) {
        if (unique->subtableZ[i].dead == 0) continue;
        nodelist = unique->subtableZ[i].nodelist;

        deleted = 0;
        slots = unique->subtableZ[i].slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != NULL) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = NULL;
        }
        if ((unsigned) deleted != unique->subtableZ[i].dead) {
            ddReportRefMess(unique, i, "cuddGarbageCollect");
        }
        totalDeletedZ += deleted;
        unique->subtableZ[i].keys -= deleted;
        unique->subtableZ[i].dead = 0;
    }

    /* No need to examine the constant table for ZDDs.
    ** If we did we should be careful not to count whatever dead
    ** nodes we found there among the dead ZDD nodes. */
    if ((unsigned) totalDeletedZ != unique->deadZ) {
        ddReportRefMess(unique, -1, "cuddGarbageCollect");
    }
    unique->keysZ -= totalDeletedZ;
    unique->deadZ = 0;
#ifdef DD_STATS
    unique->nodesFreed += (double) totalDeletedZ;
#endif


#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    unique->nextFree = cuddOrderedThread(tree,unique->nextFree);
#else
    memListTrav = unique->memoryList;
    sentry = NULL;
    while (memListTrav != NULL) {
        ptruint offset;
        nxtNode = (DdNodePtr *)memListTrav[0];
//        offset = (ptruint) memListTrav & (sizeof(DdNode) - 1);
//        memListTrav += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
        offset = (ptruint) memListTrav & (32 - 1);
        memListTrav += (32 - offset) / sizeof(DdNodePtr);

        downTrav = (DdNode *)memListTrav;
        k = 0;
        do {
            if (downTrav[k].ref == 0) {
                if (sentry == NULL) {
                    unique->nextFree = sentry = &downTrav[k];
                } else {
                    /* First hook sentry->next to the dead node and then
                    ** reassign sentry to the dead node. */
                    sentry = (sentry->next = &downTrav[k]);
                }
            }
        } while (++k < DD_MEM_CHUNK);
        memListTrav = nxtNode;
    }
    sentry->next = NULL;
#endif
#endif

    unique->GCTime += util_cpu_time() - localTime;

    hook = unique->postGCHook;
    while (hook != NULL) {
        int res = (hook->f)(unique,"DD",NULL);
        if (res == 0) return(0);
        hook = hook->next;
    }

#ifdef DD_VERBOSE
    (void) fprintf(unique->err," done\n");
#endif

    return(totalDeleted+totalDeletedZ);

}